

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int BrotliEncoderCompress
              (int quality,int lgwin,BrotliEncoderMode mode,size_t input_size,uint8_t *input_buffer,
              size_t *encoded_size,uint8_t *encoded_buffer)

{
  int iVar1;
  size_t sVar2;
  uint32_t local_a4;
  uint32_t local_a0;
  int local_9c;
  undefined4 uStack_98;
  int result;
  size_t total_out;
  uint8_t *next_out;
  size_t available_out;
  uint8_t *next_in;
  size_t available_in;
  int ok;
  int lg_win;
  size_t max_out_size;
  uint8_t *output_start;
  uint8_t *input_start;
  size_t out_size;
  BrotliEncoderState *s;
  size_t *encoded_size_local;
  uint8_t *input_buffer_local;
  size_t input_size_local;
  BrotliEncoderMode mode_local;
  int lgwin_local;
  int quality_local;
  undefined4 local_14;
  uint32_t local_10;
  undefined4 local_c;
  
  input_start = (uint8_t *)*encoded_size;
  max_out_size = (size_t)encoded_buffer;
  output_start = input_buffer;
  s = (BrotliEncoderState *)encoded_size;
  encoded_size_local = (size_t *)input_buffer;
  input_buffer_local = (uint8_t *)input_size;
  input_size_local._0_4_ = mode;
  input_size_local._4_4_ = lgwin;
  mode_local = quality;
  _ok = (uint8_t *)BrotliEncoderMaxCompressedSize(input_size);
  if (input_start == (uint8_t *)0x0) {
    lgwin_local = 0;
  }
  else if (input_buffer_local == (uint8_t *)0x0) {
    (s->params).mode = BROTLI_MODE_TEXT;
    (s->params).quality = 0;
    *encoded_buffer = '\x06';
    lgwin_local = 1;
  }
  else {
    if (mode_local == 10) {
      local_c = 0x10;
      local_10 = input_size_local._4_4_;
      if ((int)input_size_local._4_4_ < 0x10) {
        local_a0 = 0x10;
      }
      else {
        local_a0 = input_size_local._4_4_;
      }
      local_14 = 0x1e;
      quality_local = local_a0;
      if ((int)local_a0 < 0x1f) {
        local_a4 = local_a0;
      }
      else {
        local_a4 = 0x1e;
      }
      available_in._4_4_ = local_a4;
      available_in._0_4_ =
           BrotliCompressBufferQuality10
                     (local_a4,(size_t)input_buffer_local,(uint8_t *)encoded_size_local,(size_t *)s,
                      encoded_buffer);
      if (((int)available_in != 0) && ((_ok == (uint8_t *)0x0 || (*(uint8_t **)&s->params <= _ok))))
      {
        return 1;
      }
    }
    else {
      out_size = (size_t)BrotliEncoderCreateInstance
                                   ((brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
      if ((BrotliEncoderState *)out_size == (BrotliEncoderState *)0x0) {
        return 0;
      }
      next_in = input_buffer_local;
      available_out = (size_t)encoded_size_local;
      next_out = *(uint8_t **)&s->params;
      total_out = (size_t)encoded_buffer;
      _uStack_98 = 0;
      BrotliEncoderSetParameter((BrotliEncoderState *)out_size,BROTLI_PARAM_QUALITY,mode_local);
      BrotliEncoderSetParameter
                ((BrotliEncoderState *)out_size,BROTLI_PARAM_LGWIN,input_size_local._4_4_);
      BrotliEncoderSetParameter
                ((BrotliEncoderState *)out_size,BROTLI_PARAM_MODE,
                 (BrotliEncoderMode)input_size_local);
      BrotliEncoderSetParameter
                ((BrotliEncoderState *)out_size,BROTLI_PARAM_SIZE_HINT,(uint32_t)input_buffer_local)
      ;
      if (0x18 < (int)input_size_local._4_4_) {
        BrotliEncoderSetParameter((BrotliEncoderState *)out_size,BROTLI_PARAM_LARGE_WINDOW,1);
      }
      local_9c = BrotliEncoderCompressStream
                           ((BrotliEncoderState *)out_size,BROTLI_OPERATION_FINISH,
                            (size_t *)&next_in,(uint8_t **)&available_out,(size_t *)&next_out,
                            (uint8_t **)&total_out,(size_t *)&stack0xffffffffffffff68);
      iVar1 = BrotliEncoderIsFinished((BrotliEncoderState *)out_size);
      if (iVar1 == 0) {
        local_9c = 0;
      }
      (s->params).mode = uStack_98;
      (s->params).quality = result;
      BrotliEncoderDestroyInstance((BrotliEncoderState *)out_size);
      if ((local_9c != 0) && ((_ok == (uint8_t *)0x0 || (*(uint8_t **)&s->params <= _ok)))) {
        return 1;
      }
    }
    (s->params).mode = BROTLI_MODE_GENERIC;
    (s->params).quality = 0;
    if (_ok == (uint8_t *)0x0) {
      lgwin_local = 0;
    }
    else if (input_start < _ok) {
      lgwin_local = 0;
    }
    else {
      sVar2 = MakeUncompressedStream
                        (output_start,(size_t)input_buffer_local,(uint8_t *)max_out_size);
      (s->params).mode = (int)sVar2;
      (s->params).quality = (int)(sVar2 >> 0x20);
      lgwin_local = 1;
    }
  }
  return lgwin_local;
}

Assistant:

BROTLI_BOOL BrotliEncoderCompress(
    int quality, int lgwin, BrotliEncoderMode mode, size_t input_size,
    const uint8_t* input_buffer, size_t* encoded_size,
    uint8_t* encoded_buffer) {
  BrotliEncoderState* s;
  size_t out_size = *encoded_size;
  const uint8_t* input_start = input_buffer;
  uint8_t* output_start = encoded_buffer;
  size_t max_out_size = BrotliEncoderMaxCompressedSize(input_size);
  if (out_size == 0) {
    /* Output buffer needs at least one byte. */
    return BROTLI_FALSE;
  }
  if (input_size == 0) {
    /* Handle the special case of empty input. */
    *encoded_size = 1;
    *encoded_buffer = 6;
    return BROTLI_TRUE;
  }
  if (quality == 10) {
    /* TODO: Implement this direct path for all quality levels. */
    const int lg_win = BROTLI_MIN(int, BROTLI_LARGE_MAX_WINDOW_BITS,
                                       BROTLI_MAX(int, 16, lgwin));
    int ok = BrotliCompressBufferQuality10(lg_win, input_size, input_buffer,
                                           encoded_size, encoded_buffer);
    if (!ok || (max_out_size && *encoded_size > max_out_size)) {
      goto fallback;
    }
    return BROTLI_TRUE;
  }

  s = BrotliEncoderCreateInstance(0, 0, 0);
  if (!s) {
    return BROTLI_FALSE;
  } else {
    size_t available_in = input_size;
    const uint8_t* next_in = input_buffer;
    size_t available_out = *encoded_size;
    uint8_t* next_out = encoded_buffer;
    size_t total_out = 0;
    BROTLI_BOOL result = BROTLI_FALSE;
    BrotliEncoderSetParameter(s, BROTLI_PARAM_QUALITY, (uint32_t)quality);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_LGWIN, (uint32_t)lgwin);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_MODE, (uint32_t)mode);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_SIZE_HINT, (uint32_t)input_size);
    if (lgwin > BROTLI_MAX_WINDOW_BITS) {
      BrotliEncoderSetParameter(s, BROTLI_PARAM_LARGE_WINDOW, BROTLI_TRUE);
    }
    result = BrotliEncoderCompressStream(s, BROTLI_OPERATION_FINISH,
        &available_in, &next_in, &available_out, &next_out, &total_out);
    if (!BrotliEncoderIsFinished(s)) result = 0;
    *encoded_size = total_out;
    BrotliEncoderDestroyInstance(s);
    if (!result || (max_out_size && *encoded_size > max_out_size)) {
      goto fallback;
    }
    return BROTLI_TRUE;
  }
fallback:
  *encoded_size = 0;
  if (!max_out_size) return BROTLI_FALSE;
  if (out_size >= max_out_size) {
    *encoded_size =
        MakeUncompressedStream(input_start, input_size, output_start);
    return BROTLI_TRUE;
  }
  return BROTLI_FALSE;
}